

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
::LogConstraintGroup
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
           *this,BasicFlatModelAPI *be)

{
  BasicLogger *pBVar1;
  char *__str;
  BasicMemoryWriter<char,_std::allocator<char>_> *this_00;
  BasicMemoryWriter<char,_std::allocator<char>_> *s;
  allocator<char> *in_RDI;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter wrt;
  int cg;
  BasicFlatModelAPI *in_stack_fffffffffffffcf8;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
  *in_stack_fffffffffffffd00;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  BasicCStringRef<char> in_stack_fffffffffffffd20;
  BasicWriter<char> *in_stack_fffffffffffffd28;
  BasicCStringRef<char> in_stack_fffffffffffffd30;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_fffffffffffffd38;
  string_view in_stack_fffffffffffffd40;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_268;
  BasicConstraintKeeper *in_stack_fffffffffffffdb0;
  undefined1 local_241 [557];
  int local_14;
  
  local_14 = GetConstraintGroup(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  if (-1 < local_14) {
    pBVar1 = BasicConstraintKeeper::GetLogger
                       (&in_stack_fffffffffffffd00->super_BasicConstraintKeeper);
    if (pBVar1 != (BasicLogger *)0x0) {
      this_01 = (basic_string_view<char,_std::char_traits<char>_> *)local_241;
      std::allocator<char>::allocator();
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
                ((BasicMemoryWriter<char,_std::allocator<char>_> *)in_stack_fffffffffffffd20.data_,
                 in_RDI);
      std::allocator<char>::~allocator((allocator<char> *)local_241);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::MiniJSONWriter
                (&local_268,(BasicMemoryWriter<char,_std::allocator<char>_> *)(local_241 + 1));
      __str = BasicConstraintKeeper::GetShortTypeName(in_stack_fffffffffffffdb0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_01,__str);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (in_stack_fffffffffffffd38,in_stack_fffffffffffffd40);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 in_stack_fffffffffffffd00,(char **)in_stack_fffffffffffffcf8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2e7d1b);
      this_00 = (BasicMemoryWriter<char,_std::allocator<char>_> *)ConGroupName(local_14);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_01,__str);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (in_stack_fffffffffffffd38,in_stack_fffffffffffffd40);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_00,
                 (char **)in_stack_fffffffffffffcf8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2e7d82);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_01,__str);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (in_stack_fffffffffffffd38,in_stack_fffffffffffffd40);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_00,
                 (int *)in_stack_fffffffffffffcf8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2e7dcf);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2e7ddc);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xfffffffffffffd20,"\n");
      fmt::BasicWriter<char>::write<>(in_stack_fffffffffffffd28,in_stack_fffffffffffffd30);
      s = (BasicMemoryWriter<char,_std::allocator<char>_> *)
          BasicConstraintKeeper::GetLogger((BasicConstraintKeeper *)this_00);
      BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>
                ((BasicLogger *)this_00,s);
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this_00);
    }
  }
  return;
}

Assistant:

void LogConstraintGroup(
      BasicFlatModelAPI& be) override {
    auto cg = GetConstraintGroup(be);
    if (cg>=0 && GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["CON_GROUP"] = ConGroupName(cg);
        jw["CON_GROUP_index"] = cg;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }